

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O3

void __thiscall AdaptorSignature_Encrypt_Test::TestBody(AdaptorSignature_Encrypt_Test *this)

{
  void *pvVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AdaptorSignature adaptor_sig;
  string local_78;
  ByteData local_58;
  Message local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  AdaptorSignature local_28;
  
  cfd::core::AdaptorSignature::Encrypt(&local_28,&::msg,&::sk,&adaptor);
  cfd::core::AdaptorSignature::GetData(&local_58,&local_28);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_78,&local_58);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_40,"adaptor_sig_str","adaptor_sig.GetData().GetHex()",
             &adaptor_sig_str_abi_cxx11_,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pvVar1 = (void *)CONCAT71(local_58.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_58.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_58.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if (local_40.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x21,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((((long *)local_78._M_dataplus._M_p != (long *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)local_78._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Privkey::GetPubkey((Pubkey *)&local_78,&::sk);
  local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       (internal)cfd::core::AdaptorSignature::Verify(&local_28,&::msg,(Pubkey *)&local_78,&adaptor);
  local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((long *)local_78._M_dataplus._M_p == (long *)0x0) {
    if ((bool)local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start._0_1_) goto LAB_0035a28f;
  }
  else {
    operator_delete(local_78._M_dataplus._M_p,
                    local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
    if (((byte)local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start._0_1_ & 1) != 0) goto LAB_0035a28f;
  }
  testing::Message::Message(&local_40);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_78,(internal *)&local_58,
             (AssertionResult *)"adaptor_sig.Verify(msg, sk.GetPubkey(), adaptor)","false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
             ,0x22,local_78._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_30,&local_40);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (((CONCAT71(local_40.ss_.ptr_._1_7_,local_40.ss_.ptr_._0_1_) != 0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)CONCAT71(local_40.ss_.ptr_._1_7_,local_40.ss_.ptr_._0_1_) != (long *)0x0)) {
    (**(code **)(*(long *)CONCAT71(local_40.ss_.ptr_._1_7_,local_40.ss_.ptr_._0_1_) + 8))();
  }
LAB_0035a28f:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(AdaptorSignature, Encrypt) {
  auto adaptor_sig = AdaptorSignature::Encrypt(msg, sk, adaptor);

  EXPECT_EQ(adaptor_sig_str, adaptor_sig.GetData().GetHex());
  EXPECT_TRUE(adaptor_sig.Verify(msg, sk.GetPubkey(), adaptor));
}